

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O0

char * Diligent::GetBindingRangeName(BINDING_RANGE Range)

{
  char *pcStack_10;
  BINDING_RANGE Range_local;
  
  switch(Range) {
  case BINDING_RANGE_UNIFORM_BUFFER:
    pcStack_10 = "Uniform buffer";
    break;
  case BINDING_RANGE_TEXTURE:
    pcStack_10 = "Texture";
    break;
  case BINDING_RANGE_IMAGE:
    pcStack_10 = "Image";
    break;
  case BINDING_RANGE_STORAGE_BUFFER:
    pcStack_10 = "Storage buffer";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const char* GetBindingRangeName(BINDING_RANGE Range)
{
    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (Range)
    {
        // clang-format off
        case BINDING_RANGE_UNIFORM_BUFFER: return "Uniform buffer";
        case BINDING_RANGE_TEXTURE:        return "Texture";
        case BINDING_RANGE_IMAGE:          return "Image";
        case BINDING_RANGE_STORAGE_BUFFER: return "Storage buffer";
        // clang-format on
        default:
            return "Unknown";
    }
}